

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_suite.cpp
# Opt level: O0

void sum_string(void)

{
  pointer *ppbVar1;
  back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  bVar2;
  size_type in_RCX;
  char *pcVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_620;
  basic_variable<std::allocator<char>_> *local_5e8;
  basic_variable<std::allocator<char>_> *local_5b0;
  basic_variable<std::allocator<char>_> *local_578;
  iterator local_550;
  iterator local_538;
  basic_variable<std::allocator<char>_> *local_520;
  basic_variable<std::allocator<char>_> *local_518;
  basic_variable<std::allocator<char>_> *local_510;
  basic_variable<std::allocator<char>_> local_508;
  undefined1 local_4d8 [24];
  variable expect_3;
  iterator local_480;
  iterator local_468;
  undefined1 local_450 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_3;
  variable data_3;
  iterator local_400;
  iterator local_3e8;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> *local_3c8;
  basic_variable<std::allocator<char>_> *local_3c0;
  basic_variable<std::allocator<char>_> local_3b8;
  undefined1 local_388 [24];
  variable expect_2;
  iterator local_330;
  iterator local_318;
  undefined1 local_300 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_2;
  variable data_2;
  iterator local_2b0;
  iterator local_298;
  basic_variable<std::allocator<char>_> *local_280;
  basic_variable<std::allocator<char>_> *local_278;
  basic_variable<std::allocator<char>_> *local_270;
  basic_variable<std::allocator<char>_> local_268;
  undefined1 local_238 [24];
  variable expect_1;
  iterator local_1e0;
  iterator local_1c8;
  undefined1 local_1b0 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_1;
  variable data_1;
  iterator local_160;
  iterator local_148;
  basic_variable<std::allocator<char>_> *local_130;
  basic_variable<std::allocator<char>_> *local_128;
  basic_variable<std::allocator<char>_> *local_120;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_e8 [24];
  variable expect;
  iterator local_90;
  iterator local_68;
  undefined1 local_50 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result;
  variable data;
  
  ppbVar1 = &result.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)ppbVar1,"alpha");
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_68,(basic_variable<std::allocator<char>_> *)ppbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_90,
             (basic_variable<std::allocator<char>_> *)
             &result.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_50);
  std::
  partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
            (&local_68,&local_90,bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_68);
  local_120 = &local_118;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_120,"alpha");
  local_e8._0_8_ = &local_118;
  local_e8._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_e8._0_8_,init);
  local_578 = (basic_variable<std::allocator<char>_> *)local_e8;
  do {
    local_578 = local_578 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_578);
  } while (local_578 != &local_118);
  local_128 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_50);
  local_130 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_148,(basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_160,(basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  pcVar3 = "void sum_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0x48,"void sum_string()",local_128,local_130,&local_148,&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppbVar1 = &result_1.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)ppbVar1,L"bravo");
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c8,(basic_variable<std::allocator<char>_> *)ppbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,
             (basic_variable<std::allocator<char>_> *)
             &result_1.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_1b0);
  std::
  partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
            (&local_1c8,&local_1e0,bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  local_270 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_270,L"bravo");
  local_238._0_8_ = &local_268;
  local_238._8_8_ = 1;
  init_00._M_len = (size_type)pcVar3;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10),
             (basic_array<std::allocator<char>_> *)local_238._0_8_,init_00);
  local_5b0 = (basic_variable<std::allocator<char>_> *)local_238;
  do {
    local_5b0 = local_5b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5b0);
  } while (local_5b0 != &local_268);
  local_278 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_1b0);
  local_280 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_298,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2b0,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  pcVar3 = "void sum_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0x51,"void sum_string()",local_278,local_280,&local_298,&local_2b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result_1.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppbVar1 = &result_2.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)ppbVar1,L"charlie");
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_318,(basic_variable<std::allocator<char>_> *)ppbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_330,
             (basic_variable<std::allocator<char>_> *)
             &result_2.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_300);
  std::
  partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
            (&local_318,&local_330,bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  local_3c0 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3c0,L"charlie");
  local_388._0_8_ = &local_3b8;
  local_388._8_8_ = 1;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_388 + 0x10),
             (basic_array<std::allocator<char>_> *)local_388._0_8_,init_01);
  local_5e8 = (basic_variable<std::allocator<char>_> *)local_388;
  do {
    local_5e8 = local_5e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5e8);
  } while (local_5e8 != &local_3b8);
  local_3c8 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_300);
  local_3d0 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3e8,(basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_400,(basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  pcVar3 = "void sum_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0x5a,"void sum_string()",local_3c8,local_3d0,&local_3e8,&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result_2.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppbVar1 = &result_3.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)ppbVar1,L"delta");
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_468,(basic_variable<std::allocator<char>_> *)ppbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_480,
             (basic_variable<std::allocator<char>_> *)
             &result_3.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_450);
  std::
  partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
            (&local_468,&local_480,bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_480);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  local_510 = &local_508;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_510,L"delta");
  local_4d8._0_8_ = &local_508;
  local_4d8._8_8_ = 1;
  init_02._M_len = (size_type)pcVar3;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4d8._0_8_,init_02);
  local_620 = (basic_variable<std::allocator<char>_> *)local_4d8;
  do {
    local_620 = local_620 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_620);
  } while (local_620 != &local_508);
  local_518 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_450);
  local_520 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_538,(basic_variable<std::allocator<char>_> *)(local_4d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_550,(basic_variable<std::allocator<char>_> *)(local_4d8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,99,"void sum_string()",local_518,local_520,&local_538,&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_538);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4d8 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result_3.
              super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void sum_string()
{
    {
        variable data("alpha");
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data(L"bravo");
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ L"bravo" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data(u"charlie");
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ u"charlie" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data(U"delta");
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}